

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Registry.cpp
# Opt level: O0

FindFunctions * SoapySDR::Registry::listFindFunctions_abi_cxx11_(void)

{
  bool bVar1;
  reference ppVar2;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>
  *this;
  FindFunctions *in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>
  *it;
  iterator __end1;
  iterator __begin1;
  FunctionTable *__range1;
  FindFunctions *functions;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>_>
  *in_stack_ffffffffffffff98;
  _Base_ptr p_Var3;
  _Self local_38;
  _Self local_30;
  key_type *in_stack_ffffffffffffffd8;
  map<_275e82af_> *in_stack_ffffffffffffffe0;
  
  std::map<$275e82af$>::map((map<_275e82af_> *)0x173530);
  getFunctionTable_abi_cxx11_();
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>_>
       ::begin(in_stack_ffffffffffffff98);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>_>
       ::end(in_stack_ffffffffffffff98);
  while (bVar1 = std::operator!=(&local_30,&local_38), bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>
             ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>
                          *)0x173583);
    p_Var3 = (_Base_ptr)(ppVar2->second).find;
    this = (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>
            *)std::map<$275e82af$>::operator[](in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    this->_M_node = p_Var3;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>
    ::operator++(this);
  }
  return in_RDI;
}

Assistant:

SoapySDR::FindFunctions SoapySDR::Registry::listFindFunctions(void)
{
    FindFunctions functions;
    for (const auto &it : getFunctionTable())
    {
        functions[it.first] = it.second.find;
    }
    return functions;
}